

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encapsulation.cpp
# Opt level: O0

void __thiscall
Encapsulation_encapsulatedComponentMethods_Test::TestBody
          (Encapsulation_encapsulatedComponentMethods_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertionResult local_680 [2];
  AssertHelper local_660 [8];
  Message local_658 [15];
  allocator<char> local_649;
  string local_648 [39];
  bool local_621;
  undefined1 local_620 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_5f0 [8];
  Message local_5e8 [15];
  allocator<char> local_5d9;
  string local_5d8 [39];
  bool local_5b1;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar__3;
  string local_598 [32];
  AssertHelper local_578 [8];
  Message local_570 [8];
  undefined1 local_568 [8];
  AssertionResult gtest_ar_5;
  string local_550 [32];
  undefined1 local_530 [8];
  ComponentPtr c6take;
  Message local_518 [15];
  allocator<char> local_509;
  string local_508 [32];
  shared_ptr<libcellml::Component> local_4e8;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar_4;
  string local_4c0 [32];
  AssertHelper local_4a0 [8];
  Message local_498 [8];
  void *local_490;
  allocator<char> local_481;
  string local_480 [32];
  shared_ptr<libcellml::Component> local_460;
  undefined1 local_450 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_420 [8];
  Message local_418 [15];
  allocator<char> local_409;
  string local_408 [39];
  bool local_3e1;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar__2;
  Message local_3c8 [8];
  void *local_3c0;
  allocator<char> local_3b1;
  string local_3b0 [32];
  shared_ptr<libcellml::Component> local_390;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_2;
  ComponentPtr *const_c;
  AssertHelper local_348 [8];
  Message local_340 [15];
  allocator<char> local_331;
  string local_330 [39];
  bool local_309;
  undefined1 local_308 [8];
  AssertionResult gtest_ar__1;
  Message local_2f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_1;
  string local_2b0 [32];
  undefined1 local_290 [8];
  ComponentPtr constC4;
  Message local_278 [15];
  allocator<char> local_269;
  string local_268 [32];
  shared_ptr<libcellml::Component> local_248;
  undefined1 local_238 [8];
  AssertionResult gtest_ar;
  AssertHelper local_208 [8];
  Message local_200 [15];
  allocator<char> local_1f1;
  string local_1f0 [39];
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_;
  string local_1b0 [39];
  allocator<char> local_189;
  string local_188 [39];
  allocator<char> local_161;
  string local_160 [39];
  allocator<char> local_139;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [55];
  allocator<char> local_b1;
  string local_b0 [32];
  undefined1 local_90 [8];
  ComponentPtr c4n;
  ComponentPtr c6;
  ComponentPtr c5;
  ComponentPtr c4;
  ComponentPtr c3;
  ComponentPtr c2;
  ComponentPtr c1;
  ComponentPtr c;
  Encapsulation_encapsulatedComponentMethods_Test *this_local;
  
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Component::create();
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"comp1",&local_b1);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e8,"comp2",&local_e9);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c4.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_110,"comp3",&local_111);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c5.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_138,"comp4",&local_139);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_139);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c6.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_160,"comp5",&local_161);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator(&local_161);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c4n.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_188,"comp6",&local_189);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b0,"comp4new",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c4.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c5.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c6.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"comp5",&local_1f1);
  bVar1 = libcellml::ComponentEntity::containsComponent((string *)peVar3,SUB81(local_1f0,0));
  local_1c9 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c8,&local_1c9,(type *)0x0);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar2) {
    testing::Message::Message(local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar.message_,local_1c8,"c->containsComponent(\"comp5\")",
               "false");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/encapsulation.cpp"
               ,0x173,pcVar4);
    testing::internal::AssertHelper::operator=(local_208,local_200);
    testing::internal::AssertHelper::~AssertHelper(local_208);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_268,"comp4",&local_269);
  libcellml::ComponentEntity::component((string *)&local_248,SUB81(peVar3,0));
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Component>,std::shared_ptr<libcellml::Component>>
            ((EqHelper<false> *)local_238,"c4","c->component(\"comp4\")",
             (shared_ptr<libcellml::Component> *)
             &c5.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_248);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_248);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator(&local_269);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar2) {
    testing::Message::Message(local_278);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &constC4.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/encapsulation.cpp"
               ,0x175,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &constC4.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_278);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &constC4.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2b0,"comp4",(allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  libcellml::ComponentEntity::component((string *)local_290,SUB81(peVar3,0));
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_290);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((EqHelper<false> *)local_2c8,"\"comp4\"","constC4->name()",(char (*) [6])"comp4",
             &local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar2) {
    testing::Message::Message(local_2f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/encapsulation.cpp"
               ,0x177,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_330,"invalid",&local_331);
  bVar1 = libcellml::ComponentEntity::containsComponent((string *)peVar3,SUB81(local_330,0));
  local_309 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_308,&local_309,(type *)0x0);
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator(&local_331);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar2) {
    testing::Message::Message(local_340);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&const_c,local_308,"c->containsComponent(\"invalid\")","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/encapsulation.cpp"
               ,0x178,pcVar4);
    testing::internal::AssertHelper::operator=(local_348,local_340);
    testing::internal::AssertHelper::~AssertHelper(local_348);
    std::__cxx11::string::~string((string *)&const_c);
    testing::Message::~Message(local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  gtest_ar_2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)gtest_ar_2.message_.ptr_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3b0,"invalid",&local_3b1);
  libcellml::ComponentEntity::component((string *)&local_390,SUB81(peVar3,0));
  local_3c0 = (void *)0x0;
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Component>,decltype(nullptr)>
            ((EqHelper<false> *)local_380,"const_c->component(\"invalid\")","nullptr",&local_390,
             &local_3c0);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_390);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar2) {
    testing::Message::Message(local_3c8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/encapsulation.cpp"
               ,0x17a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(local_3c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_408,"comp4new",&local_409);
  bVar1 = libcellml::ComponentEntity::containsComponent((string *)peVar3,SUB81(local_408,0));
  local_3e1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3e0,&local_3e1,(type *)0x0);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator(&local_409);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
  if (!bVar2) {
    testing::Message::Message(local_418);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_3.message_,local_3e0,
               "c->containsComponent(\"comp4new\")","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_420,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/encapsulation.cpp"
               ,0x17b,pcVar4);
    testing::internal::AssertHelper::operator=(local_420,local_418);
    testing::internal::AssertHelper::~AssertHelper(local_420);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(local_418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)gtest_ar_2.message_.ptr_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_480,"comp4new",&local_481);
  libcellml::ComponentEntity::component((string *)&local_460,SUB81(peVar3,0));
  local_490 = (void *)0x0;
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Component>,decltype(nullptr)>
            ((EqHelper<false> *)local_450,"const_c->component(\"comp4new\")","nullptr",&local_460,
             &local_490);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_460);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator(&local_481);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
  if (!bVar2) {
    testing::Message::Message(local_498);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_450);
    testing::internal::AssertHelper::AssertHelper
              (local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/encapsulation.cpp"
               ,0x17c,pcVar4);
    testing::internal::AssertHelper::operator=(local_4a0,local_498);
    testing::internal::AssertHelper::~AssertHelper(local_4a0);
    testing::Message::~Message(local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_4c0,"comp4",(allocator<char> *)((long)&gtest_ar_4.message_.ptr_ + 7));
  libcellml::ComponentEntity::replaceComponent
            ((string *)peVar3,(shared_ptr *)local_4c0,SUB81(local_90,0));
  std::__cxx11::string::~string(local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_4.message_.ptr_ + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_90);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_508,"comp4new",&local_509);
  libcellml::ComponentEntity::component((string *)&local_4e8,SUB81(peVar3,0));
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Component>,std::shared_ptr<libcellml::Component>>
            ((EqHelper<false> *)local_4d8,"c4n","c->component(\"comp4new\")",
             (shared_ptr<libcellml::Component> *)local_90,&local_4e8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_4e8);
  std::__cxx11::string::~string(local_508);
  std::allocator<char>::~allocator(&local_509);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
  if (!bVar2) {
    testing::Message::Message(local_518);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &c6take.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/encapsulation.cpp"
               ,0x180,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &c6take.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_518);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &c6take.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_518);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_550,"comp6",(allocator<char> *)((long)&gtest_ar_5.message_.ptr_ + 7));
  libcellml::ComponentEntity::takeComponent((string *)local_530,SUB81(peVar3,0));
  std::__cxx11::string::~string(local_550);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_5.message_.ptr_ + 7));
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Component>,std::shared_ptr<libcellml::Component>>
            ((EqHelper<false> *)local_568,"c6","c6take",
             (shared_ptr<libcellml::Component> *)
             &c4n.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<libcellml::Component> *)local_530);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_568);
  if (!bVar2) {
    testing::Message::Message(local_570);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_568);
    testing::internal::AssertHelper::AssertHelper
              (local_578,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/encapsulation.cpp"
               ,0x183,pcVar4);
    testing::internal::AssertHelper::operator=(local_578,local_570);
    testing::internal::AssertHelper::~AssertHelper(local_578);
    testing::Message::~Message(local_570);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_568);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_598,"comp5",(allocator<char> *)((long)&gtest_ar__3.message_.ptr_ + 7));
  libcellml::ComponentEntity::removeComponent((string *)peVar3,SUB81(local_598,0));
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar__3.message_.ptr_ + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::ComponentEntity::removeComponent((shared_ptr *)peVar3,SUB81(local_90,0));
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5d8,"comp5",&local_5d9);
  bVar1 = libcellml::ComponentEntity::containsComponent((string *)peVar3,SUB81(local_5d8,0));
  local_5b1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5b0,&local_5b1,(type *)0x0);
  std::__cxx11::string::~string(local_5d8);
  std::allocator<char>::~allocator(&local_5d9);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b0);
  if (!bVar2) {
    testing::Message::Message(local_5e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__4.message_,local_5b0,"c->containsComponent(\"comp5\")",
               "true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_5f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/encapsulation.cpp"
               ,0x187,pcVar4);
    testing::internal::AssertHelper::operator=(local_5f0,local_5e8);
    testing::internal::AssertHelper::~AssertHelper(local_5f0);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(local_5e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b0);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_648,"comp4new",&local_649);
  bVar1 = libcellml::ComponentEntity::containsComponent((string *)peVar3,SUB81(local_648,0));
  local_621 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_620,&local_621,(type *)0x0);
  std::__cxx11::string::~string(local_648);
  std::allocator<char>::~allocator(&local_649);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
  if (!bVar2) {
    testing::Message::Message(local_658);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_680,local_620,"c->containsComponent(\"comp4new\")","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/encapsulation.cpp"
               ,0x188,pcVar4);
    testing::internal::AssertHelper::operator=(local_660,local_658);
    testing::internal::AssertHelper::~AssertHelper(local_660);
    std::__cxx11::string::~string((string *)local_680);
    testing::Message::~Message(local_658);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_620);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_530);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_290);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_90);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &c4n.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &c6.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &c5.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &c4.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &c3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Encapsulation, encapsulatedComponentMethods)
{
    libcellml::ComponentPtr c = libcellml::Component::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::ComponentPtr c2 = libcellml::Component::create();
    libcellml::ComponentPtr c3 = libcellml::Component::create();
    libcellml::ComponentPtr c4 = libcellml::Component::create();
    libcellml::ComponentPtr c5 = libcellml::Component::create();
    libcellml::ComponentPtr c6 = libcellml::Component::create();
    libcellml::ComponentPtr c4n = libcellml::Component::create();

    c1->setName("comp1");
    c2->setName("comp2");
    c3->setName("comp3");
    c4->setName("comp4");
    c5->setName("comp5");
    c6->setName("comp6");
    c4n->setName("comp4new");

    c->addComponent(c1);
    c1->addComponent(c2);
    c2->addComponent(c3);
    c3->addComponent(c4);
    c4->addComponent(c5);
    c5->addComponent(c6);

    // Contains component
    EXPECT_TRUE(c->containsComponent("comp5"));
    // Get component
    EXPECT_EQ(c4, c->component("comp4"));
    const libcellml::ComponentPtr constC4 = c->component("comp4");
    EXPECT_EQ("comp4", constC4->name());
    EXPECT_FALSE(c->containsComponent("invalid"));
    const libcellml::ComponentPtr &const_c = c;
    EXPECT_EQ(const_c->component("invalid"), nullptr);
    EXPECT_FALSE(c->containsComponent("comp4new"));
    EXPECT_EQ(const_c->component("comp4new"), nullptr);
    // Replace component
    c->replaceComponent("comp4", c4n);
    c4n->addComponent(c5);
    EXPECT_EQ(c4n, c->component("comp4new"));
    // Take component
    libcellml::ComponentPtr c6take = c->takeComponent("comp6");
    EXPECT_EQ(c6, c6take);
    // Remove component
    c->removeComponent("comp5");
    c->removeComponent(c4n);
    EXPECT_FALSE(c->containsComponent("comp5"));
    EXPECT_FALSE(c->containsComponent("comp4new"));
}